

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O3

void __thiscall SQLite::Database::backup(Database *this,char *apFilename,BackupType aType)

{
  Database *aSrcDatabase;
  Database *aDestDatabase;
  long in_FS_OFFSET;
  Backup bkp;
  Database otherDatabase;
  unique_ptr<sqlite3_backup,_SQLite::Backup::Deleter> local_50;
  Database local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  Database(&local_48,apFilename,6,0,(char *)0x0);
  aDestDatabase = this;
  aSrcDatabase = &local_48;
  if (aType == Save) {
    aDestDatabase = &local_48;
    aSrcDatabase = this;
  }
  Backup::Backup((Backup *)&local_50,aDestDatabase,aSrcDatabase);
  Backup::executeStep((Backup *)&local_50,-1);
  std::unique_ptr<sqlite3_backup,_SQLite::Backup::Deleter>::~unique_ptr(&local_50);
  ~Database(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Database::backup(const char* apFilename, BackupType aType)
{
    // Open the database file identified by apFilename
    Database otherDatabase(apFilename, SQLite::OPEN_READWRITE | SQLite::OPEN_CREATE);

    // For a 'Save' operation, data is copied from the current Database to the other. A 'Load' is the reverse.
    Database& src = (aType == BackupType::Save ? *this : otherDatabase);
    Database& dest = (aType == BackupType::Save ? otherDatabase : *this);

    // Set up the backup procedure to copy between the "main" databases of each connection
    Backup bkp(dest, src);
    bkp.executeStep(); // Execute all steps at once

    // RAII Finish Backup an Close the other Database
}